

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

void __thiscall
CTcParser::parse_obj_prop
          (CTcParser *this,int *err,CTPNObjDef *objdef,int replace,CTcSymMetaclass *meta_sym,
          tcprs_term_info *term_info,propset_def *propset_stack,int propset_depth,int obj_is_nested,
          int is_inline)

{
  undefined1 *puVar1;
  ushort prop;
  CTcSymMetaProp *pCVar2;
  CTcDictPropEntry *pCVar3;
  CTPNObjProp *pCVar4;
  propset_def *ppVar5;
  CTcParser *this_00;
  int *piVar6;
  wchar_t wVar7;
  tc_toktyp_t tVar8;
  CTcToken *pCVar9;
  size_t sVar10;
  CTcSymProp *pCVar11;
  CTPNAnonFunc *inline_method;
  CTcSymProp *prop_00;
  CTcPrsNode *pCVar12;
  CTPNCodeBody *code_body;
  CTcSymMetaProp **ppCVar13;
  CTPNPropList *pCVar14;
  CTcPrsNode *pCVar15;
  int iVar16;
  uint is_static;
  CTcSymMetaclass *cur_meta;
  propset_def *ppVar17;
  char *pcVar18;
  size_t __n;
  CTcDictPropEntry **ppCVar19;
  CTcSymObjBase *this_01;
  bool bVar20;
  size_t rem;
  utf8_ptr src;
  CTPNObjProp *new_prop;
  int op_args;
  CTcParser *local_148;
  int *local_140;
  CTcSymMetaclass *local_138;
  CTcPrsNode *local_130;
  CTcToken prop_tok;
  int has_retval;
  int varargs_list;
  char tmpbuf [80];
  char expbuf [80];
  
  new_prop = (CTPNObjProp *)0x0;
  local_140 = err;
  pCVar9 = CTcTokenizer::copycur(G_tok);
  prop_tok.typ_ = pCVar9->typ_;
  prop_tok._4_4_ = *(undefined4 *)&pCVar9->field_0x4;
  prop_tok.text_ = pCVar9->text_;
  prop_tok.text_len_ = pCVar9->text_len_;
  prop_tok.int_val_._0_4_ = (undefined4)pCVar9->int_val_;
  prop_tok.int_val_._4_4_ = *(undefined4 *)((long)&pCVar9->int_val_ + 4);
  prop_tok._32_8_ = *(undefined8 *)&pCVar9->field_0x20;
  if (propset_depth != 0) {
    local_148 = this;
    local_138 = meta_sym;
    if (prop_tok.typ_ == TOKT_OPERATOR) {
      CTcTokenizer::log_error(0x2bd6);
    }
    iVar16 = 10;
    if (propset_depth < 10) {
      iVar16 = propset_depth;
    }
    __n = (G_tok->curtok_).text_len_;
    memcpy(expbuf,(G_tok->curtok_).text_,__n);
    ppVar17 = propset_stack + iVar16;
    while (pcVar18 = tmpbuf, 0 < iVar16) {
      src.p_ = (char *)0x0;
      ppVar5 = ppVar17 + -1;
      if (0x50 < ppVar5->prop_pattern_len + __n) {
        CTcTokenizer::log_error(0x2bb8);
        break;
      }
      local_130 = (CTcPrsNode *)CONCAT44(local_130._4_4_,iVar16);
      ppVar17 = ppVar17 + -1;
      src.p_ = ppVar17->prop_pattern;
      rem = ppVar5->prop_pattern_len;
      while (rem != 0) {
        wVar7 = utf8_ptr::s_getch(src.p_);
        if (wVar7 == L'*') {
          if (rem != 0) {
            wVar7 = utf8_ptr::s_getch(src.p_);
            if (wVar7 == L'*') {
              utf8_ptr::inc(&src,&rem);
            }
            sVar10 = rem;
            memcpy(pcVar18,expbuf,__n);
            pcVar18 = pcVar18 + __n;
            if (sVar10 != 0) {
              memcpy(pcVar18,src.p_,sVar10);
              pcVar18 = pcVar18 + sVar10;
            }
            goto LAB_00205eb2;
          }
          break;
        }
        wVar7 = utf8_ptr::s_getch(src.p_);
        sVar10 = utf8_ptr::s_putch(pcVar18,wVar7);
        pcVar18 = pcVar18 + sVar10;
        utf8_ptr::inc(&src,&rem);
      }
      memcpy(pcVar18,expbuf,__n);
      pcVar18 = pcVar18 + __n;
LAB_00205eb2:
      __n = (long)pcVar18 - (long)tmpbuf;
      memcpy(expbuf,tmpbuf,__n);
      iVar16 = (int)local_130 + -1;
    }
    prop_tok.text_ = CTcTokenizer::store_source(G_tok,expbuf,__n);
    meta_sym = local_138;
    this = local_148;
    prop_tok.text_len_ = __n;
  }
  op_args = 0;
  if (prop_tok.typ_ == TOKT_OPERATOR) {
    parse_op_name(this,&prop_tok,&op_args);
  }
  pCVar11 = (CTcSymProp *)CTcPrsSymtab::find(this->global_symtab_,prop_tok.text_,prop_tok.text_len_)
  ;
  tVar8 = CTcTokenizer::next(G_tok);
  pCVar15 = (CTcPrsNode *)(ulong)(tVar8 - TOKT_RPAR);
  if (tVar8 - TOKT_RPAR < 2) {
LAB_00205fc9:
    prop_00 = (CTcSymProp *)0x0;
    CTcTokenizer::log_error
              (0x2b64,prop_tok.text_len_ & 0xffffffff,prop_tok.text_,
               (ulong)(uint)(G_tok->curtok_).text_len_,(G_tok->curtok_).text_);
    if ((G_tok->curtok_).typ_ == TOKT_SEM) goto LAB_0020644a;
    CTcTokenizer::next(G_tok);
LAB_00206010:
    prop_00 = (CTcSymProp *)0x0;
    goto LAB_0020644a;
  }
  if (tVar8 == TOKT_LPAR) {
LAB_00206091:
    prop_00 = look_up_prop(this,&prop_tok,1);
    if ((prop_00 != (CTcSymProp *)0x0) && (((prop_00->super_CTcSymPropBase).field_0x2a & 2) != 0)) {
      CTcTokenizer::log_error_curtok(G_tok,0x2b7b);
    }
    piVar6 = local_140;
    if (is_inline == 0) {
      pCVar15 = (CTcPrsNode *)0x1;
      code_body = parse_code_body(this,0,1,1,(int *)tmpbuf,(int *)&src,(int *)&rem,&varargs_list,
                                  (CTcSymLocal **)expbuf,&has_retval,local_140,(CTcPrsSymtab *)0x0,
                                  TCPRS_CB_NORMAL,propset_stack,propset_depth,(CTcCodeBodyRef *)0x0,
                                  (CTcFormalTypeList **)0x0);
      if (*piVar6 != 0) {
        return;
      }
      if (op_args != 0) {
        if (code_body != (CTPNCodeBody *)0x0) {
          puVar1 = &(code_body->super_CTPNCodeBodyBase).field_0xb9;
          *puVar1 = *puVar1 | 2;
        }
        if (((int)rem != 0) || (tmpbuf._0_4_ != op_args + -1)) {
          CTcTokenizer::log_error(0x2bd9,(ulong)(op_args - 1));
        }
      }
      if (prop_00 != (CTcSymProp *)0x0) {
        new_prop = CTPNObjDef::add_method(objdef,prop_00,code_body,pCVar15,replace);
      }
    }
    else {
      CTcTokenizer::unget(G_tok);
      inline_method = CTcPrsOpUnary::parse_anon_func(0,1);
      if (inline_method != (CTPNAnonFunc *)0x0) {
        new_prop = CTPNObjDef::add_inline_method
                             (objdef,prop_00,inline_method,(CTcPrsNode *)0x0,replace);
      }
    }
    goto LAB_0020644a;
  }
  if (((tVar8 == TOKT_SEM) || (tVar8 == TOKT_RBRACE)) || (tVar8 == TOKT_RBRACK)) goto LAB_00205fc9;
  if (tVar8 == TOKT_EQ) {
    CTcTokenizer::next(G_tok);
    if ((G_tok->curtok_).typ_ == TOKT_LBRACE) {
      CTcTokenizer::log_error(0x2b20);
      goto LAB_00206091;
    }
  }
  else {
    if (tVar8 == TOKT_COLON) {
      if ((pCVar11 != (CTcSymProp *)0x0) &&
         (*(int *)&((CVmHashEntry *)
                   &(pCVar11->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->field_0x24
          == 2)) {
        CTcMain::log_error(G_tcmain,term_info->desc_,term_info->linenum_,TC_SEV_ERROR,0x2baf);
        CTcTokenizer::unget(G_tok);
        term_info->unterm_ = 1;
        return;
      }
      CTcTokenizer::next(G_tok);
      iVar16 = (*objdef->_vptr_CTPNObjDef[1])
                         (objdef,&new_prop,local_140,term_info,&prop_tok,(ulong)(uint)replace);
      if (iVar16 == 0) {
        return;
      }
      goto LAB_00206010;
    }
    if (tVar8 == TOKT_LBRACE) goto LAB_00206091;
    CTcTokenizer::log_error_curtok(G_tok,0x2b6d);
  }
  pCVar9 = &prop_tok;
  prop_00 = look_up_prop(this,pCVar9,1);
  local_148 = this;
  local_138 = meta_sym;
  if (prop_00 == (CTcSymProp *)0x0) {
    tmpbuf[0] = '\0';
    tmpbuf[1] = '\0';
    tmpbuf[2] = '\0';
    tmpbuf[3] = '\0';
    tmpbuf[4] = '\0';
    tmpbuf[5] = '\0';
    tmpbuf[6] = '\0';
    tmpbuf[7] = '\0';
    rem = 0;
LAB_002062f7:
    bVar20 = (G_tok->curtok_).typ_ == TOKT_STATIC;
    if (bVar20) {
      CTcTokenizer::next(G_tok);
    }
    this_00 = local_148;
    is_static = (uint)bVar20;
    begin_prop_expr(local_148,(CTcPrsPropExprSave *)expbuf,is_static,is_inline);
    pCVar12 = parse_expr_or_dstr(this_00,1);
    if (pCVar12 == (CTcPrsNode *)0x0) {
      *local_140 = 1;
      return;
    }
    pCVar15 = (CTcPrsNode *)tmpbuf;
    src.p_ = (char *)pCVar12;
    finish_prop_expr(this_00,(CTcPrsPropExprSave *)expbuf,(CTcPrsNode **)&src,
                     (CTPNCodeBody **)pCVar15,(CTPNAnonFunc **)&rem,is_static,is_inline,prop_00);
  }
  else {
    tmpbuf[0] = '\0';
    tmpbuf[1] = '\0';
    tmpbuf[2] = '\0';
    tmpbuf[3] = '\0';
    tmpbuf[4] = '\0';
    tmpbuf[5] = '\0';
    tmpbuf[6] = '\0';
    tmpbuf[7] = '\0';
    rem = 0;
    if (((prop_00->super_CTcSymPropBase).field_0x2a & 2) == 0) goto LAB_002062f7;
    if ((G_tok->curtok_).typ_ != TOKT_SSTR) {
      CTcTokenizer::log_error_curtok(G_tok,0x2b7b);
      goto LAB_002062f7;
    }
    pCVar12 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)pCVar9);
    *(undefined4 *)&pCVar12[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 10;
    *(undefined1 *)&pCVar12[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
    (pCVar12->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0030e698;
    if (this->dict_cur_ == (CTcDictEntry *)0x0) {
      CTcTokenizer::log_error(0x2b7c);
    }
    local_130 = pCVar12;
    if (objdef == (CTPNObjDef *)0x0) {
      this_01 = (CTcSymObjBase *)0x0;
    }
    else {
      this_01 = &objdef->obj_sym_->super_CTcSymObjBase;
    }
    do {
      if (this_01 != (CTcSymObjBase *)0x0) {
        prop = (prop_00->super_CTcSymPropBase).prop_;
        pCVar15 = (CTcPrsNode *)(ulong)prop;
        CTcSymObjBase::add_vocab_word
                  (this_01,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_,prop);
      }
      tVar8 = CTcTokenizer::next(G_tok);
    } while (tVar8 == TOKT_SSTR);
    is_static = 0;
    pCVar12 = local_130;
  }
  meta_sym = local_138;
  this = local_148;
  if (prop_00 != (CTcSymProp *)0x0) {
    if (tmpbuf._0_8_ == 0) {
      if (rem == 0) {
        new_prop = CTPNObjDef::add_prop(objdef,prop_00,pCVar12,replace,is_static);
        meta_sym = local_138;
        this = local_148;
      }
      else {
        new_prop = CTPNObjDef::add_inline_method(objdef,prop_00,(CTPNAnonFunc *)rem,pCVar12,replace)
        ;
        meta_sym = local_138;
        this = local_148;
      }
    }
    else {
      new_prop = CTPNObjDef::add_method(objdef,prop_00,(CTPNCodeBody *)tmpbuf._0_8_,pCVar15,replace)
      ;
      meta_sym = local_138;
      this = local_148;
    }
  }
LAB_0020644a:
  if (pCVar11 != (CTcSymProp *)0x0) {
    if ((obj_is_nested == 0) || (pCVar11 != this->lexical_parent_sym_)) {
      pCVar14 = &objdef->proplist_;
      while (pCVar4 = pCVar14->first_, pCVar4 != (CTPNObjProp *)0x0) {
        if ((pCVar4 != new_prop) && ((pCVar4->super_CTPNObjPropBase).prop_sym_ == pCVar11)) {
          if (((pCVar4->super_CTPNObjPropBase).field_0x58 & 2) == 0) goto LAB_0020646a;
          (*objdef->_vptr_CTPNObjDef[2])(objdef);
          break;
        }
        pCVar14 = (CTPNPropList *)&(pCVar4->super_CTPNObjPropBase).nxt_;
      }
    }
    else {
LAB_0020646a:
      CTcTokenizer::log_error
                (0x2b6c,(ulong)(uint)((CVmHashEntry *)
                                     &(pCVar11->super_CTcSymPropBase).super_CTcSymbol.
                                      super_CTcSymbolBase)->len_,
                 ((CVmHashEntry *)
                 &(pCVar11->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->str_);
    }
  }
  if (prop_00 != (CTcSymProp *)0x0 && meta_sym != (CTcSymMetaclass *)0x0) {
    for (; meta_sym != (CTcSymMetaclass *)0x0;
        meta_sym = (meta_sym->super_CTcSymMetaclassBase).super_meta_) {
      ppCVar13 = &(meta_sym->super_CTcSymMetaclassBase).prop_head_;
      do {
        pCVar2 = *ppCVar13;
        if (pCVar2 == (CTcSymMetaProp *)0x0) goto LAB_002064be;
        ppCVar13 = &pCVar2->nxt_;
      } while (pCVar2->prop_ != prop_00);
      CTcTokenizer::log_error
                (0x2d17,(prop_00->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                        super_CVmHashEntryCS.super_CVmHashEntry.len_,
                 (prop_00->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.str_);
LAB_002064be:
    }
  }
  if ((prop_00 != (CTcSymProp *)0x0) && (((prop_00->super_CTcSymPropBase).field_0x2a & 2) != 0)) {
    ppCVar19 = &this->dict_prop_head_;
    while (pCVar3 = *ppCVar19, pCVar3 != (CTcDictPropEntry *)0x0) {
      if (pCVar3->prop_ == prop_00) {
        pCVar3->field_0x10 = pCVar3->field_0x10 | 1;
        return;
      }
      ppCVar19 = &pCVar3->nxt_;
    }
  }
  return;
}

Assistant:

void CTcParser::parse_obj_prop(
    int *err, CTPNObjDef *objdef, int replace, CTcSymMetaclass *meta_sym,
    tcprs_term_info *term_info, propset_def *propset_stack, int propset_depth,
    int obj_is_nested, int is_inline)
{
    /* we haven't created the new property yet */
    CTPNObjProp *new_prop = 0;

    /* presume it's not a static property definition */
    int is_static = FALSE;
    
    /* remember the property token */
    CTcToken prop_tok = *G_tok->copycur();

    /* 
     *   if we're in a property set, apply the property set pattern to the
     *   property name 
     */
    if (propset_depth != 0)
    {
        /* we can't define operator overloads here */
        if (prop_tok.gettyp() == TOKT_OPERATOR)
            G_tok->log_error(TCERR_OPER_IN_PROPSET);
        
        /*
         *   Build the real property name based on all enclosing propertyset
         *   pattern strings.  Start with the current (innermost) pattern,
         *   then apply the next pattern out, and so on.
         *   
         *   Note that if the current nesting depth is greater than the
         *   maximum nesting depth, ignore the illegally deep levels and
         *   just start with the deepest legal level.  
         */
        int i = propset_depth;
		if (i > (int)MAX_PROPSET_DEPTH)
            i = MAX_PROPSET_DEPTH;
        
        /* start with the current token */
        size_t explen = G_tok->getcur()->get_text_len();
        char expbuf[TOK_SYM_MAX_LEN];
        memcpy(expbuf, G_tok->getcur()->get_text(), explen);
        
        /* iterate through the propertyset stack */
        for (propset_def *cur = &propset_stack[i-1] ; i > 0 ; --i, --cur)
        {
            char tmpbuf[TOK_SYM_MAX_LEN];
            utf8_ptr src;
            utf8_ptr dst;
            size_t rem;

            /* if we'd exceed the maximum token length, stop here */
            if (explen + cur->prop_pattern_len > TOK_SYM_MAX_LEN)
            {
                /* complain about it */
                G_tok->log_error(TCERR_PROPSET_TOK_TOO_LONG);
                
                /* stop the expansion */
                break;
            }
            
            /* copy the pattern up to the '*' */
            for (src.set((char *)cur->prop_pattern),
                 dst.set(tmpbuf), rem = cur->prop_pattern_len ;
                 rem != 0 && src.getch() != '*' ; src.inc(&rem))
            {
                /* copy this character */
                dst.setch(src.getch());
            }
            
            /* if we found a '*', skip it */
            if (rem != 0 && src.getch() == '*')
                src.inc(&rem);
            
            /* insert the expansion from the last round here */
            memcpy(dst.getptr(), expbuf, explen);
            
            /* advance our output pointer */
            dst.set(dst.getptr() + explen);
            
            /* copy the remainder of the pattern string */
            if (rem != 0)
            {
                /* copy the remaining bytes */
                memcpy(dst.getptr(), src.getptr(), rem);

                /* advance the output pointer past the copied bytes */
                dst.set(dst.getptr() + rem);
            }
            
            /* copy the result back to the expansion buffer */
            explen = dst.getptr() - tmpbuf;
            memcpy(expbuf, tmpbuf, explen);
        }

        /* store the new token in tokenizer memory */
        prop_tok.set_text(G_tok->store_source(expbuf, explen), explen);
    }

    /* presume we won't find a valid symbol for the property token */
    CTcSymProp *prop_sym = 0;

    /* presume it's not an operator overload property */
    int op_args = 0;

    /* if this is an 'operator' property, the syntax is special */
    if (prop_tok.gettyp() == TOKT_OPERATOR)
        parse_op_name(&prop_tok, &op_args);

    /* 
     *   look up the property token as a symbol, to see if it's already
     *   defined - we don't want to presume it's a property quite yet, but
     *   we can at least look to see if it's defined as something else 
     */
    CTcSymbol *sym = global_symtab_->find(
        prop_tok.get_text(), prop_tok.get_text_len());

    /* skip it and see what comes next */
    switch (G_tok->next())
    {
    case TOKT_LPAR:
    case TOKT_LBRACE:
    parse_method:
        /* look up the symbol */
        prop_sym = look_up_prop(&prop_tok, TRUE);

        /* vocabulary properties can't be code */
        if (prop_sym != 0 && prop_sym->is_vocab())
            G_tok->log_error_curtok(TCERR_VOCAB_REQ_SSTR);

        /* 
         *   A left paren starts a formal parameter list, a left brace starts
         *   a code body - in either case, we have a method, so parse the
         *   code body.  If we're parsing an inline object definition, parse
         *   it as an anonymous method definition instead.
         */
        if (is_inline)
        {
            /* inline object - parse an anonymous method */
            G_tok->unget();
            CTPNAnonFunc *m = CTcPrsOpUnary::parse_anon_func(FALSE, TRUE);

            /* add this as a property expression */
            if (m != 0)
                new_prop = objdef->add_inline_method(prop_sym, m, 0, replace);
        }
        else
        {
            /* top-level object - parse a code body */
            int argc;
            int opt_argc;
            int varargs;
            int varargs_list;
            CTcSymLocal *varargs_list_local;
            int has_retval;
            CTPNCodeBody *code_body = parse_code_body(
                FALSE, TRUE, TRUE, &argc, &opt_argc, &varargs,
                &varargs_list, &varargs_list_local, &has_retval, err, 0,
                TCPRS_CB_NORMAL, propset_stack, propset_depth, 0, 0);

            /* check for errors in the code body */
            if (*err)
                return;

            /* 
             *   if this is an operator, check arguments, and pick the
             *   correct operator for the number of operands for operators
             *   with multiple operand numbers 
             */
            if (op_args != 0)
            {
                /* mark the code body as an operator overload method */
                if (code_body != 0)
                    code_body->set_operator_overload(TRUE);
                
                /* varargs aren't allowed */
                if (varargs)
                {
                    G_tok->log_error(
                        TCERR_OP_OVERLOAD_WRONG_FORMALS, op_args - 1);
                }
                else if (argc != op_args - 1)
                {
                    /* not a valid combination of operator and arguments */
                    G_tok->log_error(
                        TCERR_OP_OVERLOAD_WRONG_FORMALS, op_args - 1);
                }
            }
            
            /* add the method definition */
            if (prop_sym != 0)
                new_prop = objdef->add_method(prop_sym, code_body, 0, replace);
        }
        break;

    case TOKT_SEM:
    case TOKT_RBRACE:
    case TOKT_RPAR:
    case TOKT_RBRACK:
    case TOKT_COMMA:
        /* log the error */
        G_tok->log_error(TCERR_OBJDEF_REQ_PROPVAL,
                         (int)prop_tok.get_text_len(), prop_tok.get_text(),
                         (int)G_tok->getcur()->get_text_len(),
                         G_tok->getcur()->get_text());

        /* if it's anything other than a semicolon, skip it */
        if (G_tok->cur() != TOKT_SEM)
            G_tok->next();
        break;

    case TOKT_COLON:
        /*
         *   It's a nested object definition.  The value of the property is a
         *   reference to an anonymous object defined in-line after the
         *   colon.  The in-line object definition uses the "braces" version
         *   of the standard syntax: after the colon we have the class list,
         *   an open brace, the property list, and a close brace.
         *   
         *   Note that we hold off defining the property symbol for as long
         *   as possible, since we want to make sure that we don't have a
         *   syntax error where this was intended to be a whole new top-level
         *   object definition, but the terminator was accidentally left off
         *   the previous object.  In this case, the new object definition
         *   would look like a nested object rather than a new top-level
         *   object.  This is probably the case if the symbol before the
         *   colon is already known as an object name.
         */
        {
            /* 
             *   If the symbol before the colon is already known as an object
             *   name, it must be intended as a new object rather than a
             *   nested object, meaning that the terminator is missing from
             *   the previous object definition.  If this is the case, flag
             *   the termination error and proceed to parse the new object
             *   definition.  
             */
            if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
            {
                /* 
                 *   flag the unterminated object error - note that the
                 *   location where termination should have occurred is
                 *   where the caller tells us 
                 */
                G_tcmain->log_error(term_info->desc_, term_info->linenum_,
                                    TC_SEV_ERROR, TCERR_UNTERM_OBJ_DEF);

                /* unget the colon so we can parse the new object def */
                G_tok->unget();

                /* flag the termination error for the caller */
                term_info->unterm_ = TRUE;

                /* we're done */
                return;
            }

            /* skip the colon */
            G_tok->next();

            /* parse the nested object property */
            if (!objdef->parse_nested_obj_prop(
                new_prop, err, term_info, &prop_tok, replace))
                return;
        }
        
        /* done */
        break;

    case TOKT_EQ:
        /* skip the '=' */
        G_tok->next();

        /* 
         *   if a brace follows, this must be using the obsolete TADS 2
         *   notation, in which an equals sign followed a property name even
         *   if a method was being defined; if this is the case, generate an
         *   error, but then proceed to treat what follows as a method 
         */
        if (G_tok->cur() == TOKT_LBRACE)
        {
            /* log the error... */
            G_tok->log_error(TCERR_EQ_WITH_METHOD_OBSOLETE);

            /* ...but then go ahead and parse it as a method anyway */
            goto parse_method;
        }

        /* go parse the value */
        goto parse_value;

    default:
        /* 
         *   an '=' is required after a value property name; log the error
         *   and proceed, assuming that the '=' was left out but that the
         *   property value is otherwise well-formed 
         */
        G_tok->log_error_curtok(TCERR_PROP_REQ_EQ);

    parse_value:
        {
            /* look up the property symbol */
            prop_sym = look_up_prop(&prop_tok, TRUE);

            /* note if it's a vocabulary property */
            int is_vocab_prop = (prop_sym != 0 && prop_sym->is_vocab());

            /* we don't know whether we have a constant or method yet */
            CTPNCodeBody *code_body = 0;
            CTcPrsNode *expr = 0;
            CTPNAnonFunc *inline_method = 0;

            /* 
             *   if this is a vocabulary property, perform special vocabulary
             *   list parsing - a vocabulary property can have one or more
             *   single-quoted strings that we store in a list, but the list
             *   does not have to be enclosed in brackets 
             */
            if (is_vocab_prop && G_tok->cur() == TOKT_SSTR)
            {
                /* 
                 *   set the property to a vocab list placeholder for now in
                 *   the object - we'll replace it during linking with the
                 *   actual vocabulary list
                 */
                CTcConstVal cval;
                cval.set_vocab_list();
                expr = new CTPNConst(&cval);
                
                /* if I have no dictionary, it's an error */
                if (dict_cur_ == 0)
                    G_tok->log_error(TCERR_VOCAB_NO_DICT);
                
                /* get the object symbol */
                CTcSymObj *obj_sym = (objdef != 0 ? objdef->get_obj_sym() : 0);
                
                /* parse the list entries */
                for (;;)
                {
                    /* add the word to our vocabulary list */
                    if (obj_sym != 0)
                        obj_sym->add_vocab_word(
                            G_tok->getcur()->get_text(),
                            G_tok->getcur()->get_text_len(),
                            prop_sym->get_prop());
                    
                    /* 
                     *   skip the string; if another string doesn't
                     *   immediately follow, we're done with the implied list
                     *   
                     */
                    if (G_tok->next() != TOKT_SSTR)
                        break;
                }
            }
            else
            {
                /* if it's a vocabulary property, other types aren't allowed */
                if (is_vocab_prop)
                    G_tok->log_error_curtok(TCERR_VOCAB_REQ_SSTR);
                
                /* check for the 'static' keyword */
                if (G_tok->cur() == TOKT_STATIC)
                {
                    /* note that it's static */
                    is_static = TRUE;

                    /* skip the 'static' keyword */
                    G_tok->next();
                }
                
                /* prepare to parse the property value expression */
                CTcPrsPropExprSave save_info;
                begin_prop_expr(&save_info, is_static, is_inline);
                
                /* 
                 *   parse the expression (which can be a double-quoted
                 *   string instead of a value expression) 
                 */
                expr = parse_expr_or_dstr(TRUE);
                if (expr == 0)
                {
                    *err = TRUE;
                    return;
                }
                
                /* 
                 *   finish the expression, and check to see if it needs
                 *   dynamic evaluation (if so, it will yield a code body)
                 */
                finish_prop_expr(
                    &save_info, expr, code_body, inline_method,
                    is_static, is_inline, prop_sym);
            }

            /* if we have a valid property and expression, add it */
            if (prop_sym != 0)
            {
                /* add the expression or code body, as appropriate */
                if (code_body != 0)
                {
                    /* method */
                    new_prop = objdef->add_method(
                        prop_sym, code_body, expr, replace);
                }
                else if (inline_method != 0)
                {
                    /* inline method */
                    new_prop = objdef->add_inline_method(
                        prop_sym, inline_method, expr, replace);
                }
                else if (expr != 0)
                {
                    /* constant expression */
                    new_prop = objdef->add_prop(
                        prop_sym, expr, replace, is_static);
                }
            }
        }
        
        /* done with the property */
        break;
    }

    /* make sure that the object doesn't already define this propery */
    if (sym != 0)
    {
        /* presume it's not a duplicate */
        int is_dup = FALSE;

        /* 
         *   if the enclosing object is nested, and this is the lexicalParent
         *   property, then it's defined automatically by the compiler and
         *   thus can't be redefined explicitly 
         */
        if (obj_is_nested && sym == lexical_parent_sym_)
            is_dup = TRUE;

        /* if we didn't already find a duplicate, scan the existing list */
        if (!is_dup)
        {
            /* scan the property list for this object */
            for (CTPNObjProp *obj_prop = objdef->get_first_prop() ;
                 obj_prop != 0 ; obj_prop = obj_prop->get_next_prop())
            {
                /* 
                 *   if it matches (and it's not the one we just added), log
                 *   an error 
                 */
                if (obj_prop != new_prop && obj_prop->get_prop_sym() == sym)
                {
                    /* 
                     *   if this property is overwritable, we're allowed to
                     *   replace it with a new value; otherwise, it's an
                     *   illegal duplicate 
                     */
                    if (obj_prop->is_overwritable())
                    {
                        /* 
                         *   we're allowed to overwrite it with an explicit
                         *   redefinition; simply remove the old property
                         *   from the list so we can add the new one 
                         */
                        objdef->delete_property(obj_prop->get_prop_sym());
                    }
                    else
                    {
                        /* note that we found a duplicate property */
                        is_dup = TRUE;
                    }

                    /* no need to continue looking */
                    break;
                }
            }
        }

        /* if we found a duplicate, log an error */
        if (is_dup)
            G_tok->log_error(TCERR_PROP_REDEF_IN_OBJ,
                             (int)sym->get_sym_len(), sym->get_sym());
    }

    /* 
     *   if we're modifying an intrinsic class, make sure the property isn't
     *   defined in the class's native interface 
     */
    if (meta_sym != 0 && prop_sym != 0)
    {
        /* check this intrinsic class and all of its superclasses */
        for (CTcSymMetaclass *cur_meta = meta_sym ; cur_meta != 0 ;
             cur_meta = cur_meta->get_super_meta())
        {
            /* scan the list of native methods */
            for (CTcSymMetaProp *mprop = cur_meta->get_prop_head() ;
                 mprop != 0 ; mprop = mprop->nxt_)
            {
                /* if it matches, flag an error */
                if (mprop->prop_ == prop_sym)
                {
                    /* log the error */
                    G_tok->log_error(TCERR_CANNOT_MOD_META_PROP,
                                     prop_sym->get_sym_len(),
                                     prop_sym->get_sym());
                    
                    /* no need to look any further */
                    break;
                }
            }
        }
    }

    /* 
     *   if this is a dictionary property, note that it's been defined for
     *   this object 
     */
    if (prop_sym != 0 && prop_sym->is_vocab())
    {
        /* scan the list of dictionary properties for this one */
        for (CTcDictPropEntry *entry = dict_prop_head_ ; entry != 0 ;
             entry = entry->nxt_)
        {
            /* check this one for a match */
            if (entry->prop_ == prop_sym)
            {
                /* mark this entry as defined for this object */
                entry->defined_ = TRUE;

                /* no need to look any further */
                break;
            }
        }
    }
}